

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_options.cpp
# Opt level: O2

string * __thiscall
RandomizerOptions::permalink_abi_cxx11_(string *__return_storage_ptr__,RandomizerOptions *this)

{
  uint8_t value;
  bool bVar1;
  size_t i;
  long lVar2;
  BitstreamWriter bitpack;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  bitpack._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bitpack._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bitpack._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bitpack._bit_position = '\b';
  BitstreamWriter::add_variable_length_number(&bitpack,0x12);
  BitstreamWriter::pack(&bitpack,this->_goal);
  BitstreamWriter::pack(&bitpack,this->_jewel_count);
  BitstreamWriter::pack(&bitpack,this->_starting_life);
  BitstreamWriter::pack(&bitpack,this->_starting_gold);
  BitstreamWriter::pack(&bitpack,this->_health_gained_per_lifestock);
  BitstreamWriter::add_bit(&bitpack,this->_fast_transitions);
  BitstreamWriter::pack(&bitpack,this->_seed);
  BitstreamWriter::add_bit(&bitpack,this->_use_armor_upgrades);
  BitstreamWriter::add_bit(&bitpack,this->_fix_armlet_skip);
  BitstreamWriter::add_bit(&bitpack,this->_remove_tree_cutting_glitch_drops);
  BitstreamWriter::add_bit(&bitpack,this->_consumable_record_book);
  BitstreamWriter::add_bit(&bitpack,this->_consumable_spell_book);
  BitstreamWriter::add_bit(&bitpack,this->_remove_gumi_boulder);
  BitstreamWriter::add_bit(&bitpack,this->_remove_tibor_requirement);
  BitstreamWriter::add_bit(&bitpack,this->_all_trees_visited_at_start);
  BitstreamWriter::add_bit(&bitpack,this->_ekeeke_auto_revive);
  BitstreamWriter::add_bit(&bitpack,this->_allow_spoiler_log);
  BitstreamWriter::add_bit(&bitpack,this->_shuffle_tibor_trees);
  BitstreamWriter::add_bit(&bitpack,this->_enemy_jumping_in_logic);
  BitstreamWriter::add_bit(&bitpack,this->_tree_cutting_glitch_in_logic);
  BitstreamWriter::add_bit(&bitpack,this->_damage_boosting_in_logic);
  BitstreamWriter::add_bit(&bitpack,this->_allow_whistle_usage_behind_trees);
  BitstreamWriter::add_bit(&bitpack,this->_ensure_ekeeke_in_shops);
  BitstreamWriter::pack_array<unsigned_char,69ul>(&bitpack,&this->_items_distribution);
  BitstreamWriter::pack(&bitpack,this->_filler_item);
  BitstreamWriter::pack(&bitpack,this->_hints_distribution_region_requirement);
  BitstreamWriter::pack(&bitpack,this->_hints_distribution_item_requirement);
  BitstreamWriter::pack(&bitpack,this->_hints_distribution_item_location);
  BitstreamWriter::pack(&bitpack,this->_hints_distribution_dark_region);
  BitstreamWriter::pack(&bitpack,this->_hints_distribution_joke);
  BitstreamWriter::add_bit(&bitpack,this->_christmas_event);
  BitstreamWriter::add_bit(&bitpack,this->_secret_event);
  BitstreamWriter::pack_if<unsigned_short>
            (&bitpack,this->_enemies_damage_factor != 100,this->_enemies_damage_factor);
  BitstreamWriter::pack_if<unsigned_short>
            (&bitpack,this->_enemies_health_factor != 100,this->_enemies_health_factor);
  BitstreamWriter::pack_if<unsigned_short>
            (&bitpack,this->_enemies_armor_factor != 100,this->_enemies_armor_factor);
  BitstreamWriter::pack_if<unsigned_short>
            (&bitpack,this->_enemies_golds_factor != 100,this->_enemies_golds_factor);
  BitstreamWriter::pack_if<unsigned_short>
            (&bitpack,this->_enemies_drop_chance_factor != 100,this->_enemies_drop_chance_factor);
  BitstreamWriter::pack_if<unsigned_short>
            (&bitpack,this->_shop_prices_factor != 100,this->_shop_prices_factor);
  for (lVar2 = 0; lVar2 != 0x3e; lVar2 = lVar2 + 1) {
    value = (this->_starting_items)._M_elems[lVar2];
    if (value != '\0') {
      BitstreamWriter::add_bit(&bitpack,true);
      BitstreamWriter::pack(&bitpack,(uint8_t)lVar2);
      BitstreamWriter::pack(&bitpack,value);
    }
  }
  BitstreamWriter::add_bit(&bitpack,false);
  BitstreamWriter::pack_vector<unsigned_char>(&bitpack,&this->_possible_spawn_locations);
  BitstreamWriter::pack_vector<unsigned_char>(&bitpack,&this->_finite_ground_items);
  BitstreamWriter::pack_vector<unsigned_char>(&bitpack,&this->_finite_shop_items);
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::empty(&this->_world_json);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,&this->_world_json
              );
  BitstreamWriter::pack_vector_if<unsigned_char>
            (&bitpack,!bVar1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::empty(&this->_model_patch_items);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,
               &this->_model_patch_items);
  BitstreamWriter::pack_vector_if<unsigned_char>
            (&bitpack,!bVar1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::empty(&this->_model_patch_spawns);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,
               &this->_model_patch_spawns);
  BitstreamWriter::pack_vector_if<unsigned_char>
            (&bitpack,!bVar1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::empty(&this->_model_patch_hint_sources);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,
               &this->_model_patch_hint_sources);
  BitstreamWriter::pack_vector_if<unsigned_char>
            (&bitpack,!bVar1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  base64_encode_abi_cxx11_(&local_50,&bitpack._bytes);
  std::operator+(&local_70,"l",&local_50);
  std::operator+(__return_storage_ptr__,&local_70,"s");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bitpack);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomizerOptions::permalink() const
{
    BitstreamWriter bitpack;

    bitpack.pack((uint8_t)MAJOR_RELEASE);

    bitpack.pack(_goal);
    bitpack.pack(_jewel_count);
    bitpack.pack(_starting_life);
    bitpack.pack(_starting_gold);
    bitpack.pack(_health_gained_per_lifestock);
    bitpack.pack(_fast_transitions);

    bitpack.pack(_seed);

    bitpack.pack(_use_armor_upgrades);
    bitpack.pack(_fix_armlet_skip);
    bitpack.pack(_remove_tree_cutting_glitch_drops);
    bitpack.pack(_consumable_record_book);
    bitpack.pack(_consumable_spell_book);
    bitpack.pack(_remove_gumi_boulder);
    bitpack.pack(_remove_tibor_requirement);
    bitpack.pack(_all_trees_visited_at_start);
    bitpack.pack(_ekeeke_auto_revive);
    bitpack.pack(_allow_spoiler_log);
    bitpack.pack(_shuffle_tibor_trees);
    bitpack.pack(_enemy_jumping_in_logic);
    bitpack.pack(_tree_cutting_glitch_in_logic);
    bitpack.pack(_damage_boosting_in_logic);
    bitpack.pack(_allow_whistle_usage_behind_trees);
    bitpack.pack(_ensure_ekeeke_in_shops);
    bitpack.pack_array(_items_distribution);
    bitpack.pack(_filler_item);
    bitpack.pack(_hints_distribution_region_requirement);
    bitpack.pack(_hints_distribution_item_requirement);
    bitpack.pack(_hints_distribution_item_location);
    bitpack.pack(_hints_distribution_dark_region);
    bitpack.pack(_hints_distribution_joke);
    bitpack.pack(_christmas_event);
    bitpack.pack(_secret_event);

    bitpack.pack_if(_enemies_damage_factor != 100, _enemies_damage_factor);
    bitpack.pack_if(_enemies_health_factor != 100, _enemies_health_factor);
    bitpack.pack_if(_enemies_armor_factor != 100, _enemies_armor_factor);
    bitpack.pack_if(_enemies_golds_factor != 100, _enemies_golds_factor);
    bitpack.pack_if(_enemies_drop_chance_factor != 100, _enemies_drop_chance_factor);
    bitpack.pack_if(_shop_prices_factor != 100, _shop_prices_factor);

    for(size_t i=0 ; i<_starting_items.size() ; ++i)
    {
        uint8_t item_id = (uint8_t)i;
        uint8_t quantity = _starting_items[i];
        if(quantity != 0)
        {
            bitpack.pack(true);
            bitpack.pack(item_id);
            bitpack.pack(quantity);
        }
    }
    bitpack.pack(false);

    bitpack.pack_vector(_possible_spawn_locations);
    bitpack.pack_vector(_finite_ground_items);
    bitpack.pack_vector(_finite_shop_items);

    bitpack.pack_vector_if(!_world_json.empty(), Json::to_msgpack(_world_json));
    bitpack.pack_vector_if(!_model_patch_items.empty(), Json::to_msgpack(_model_patch_items));
    bitpack.pack_vector_if(!_model_patch_spawns.empty(), Json::to_msgpack(_model_patch_spawns));
    bitpack.pack_vector_if(!_model_patch_hint_sources.empty(), Json::to_msgpack(_model_patch_hint_sources));

    return "l" + base64_encode(bitpack.bytes()) + "s";
}